

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
::delete_db_node_ptr_at_scope_exit::~delete_db_node_ptr_at_scope_exit
          (delete_db_node_ptr_at_scope_exit *this)

{
  ulong uVar1;
  undefined1 local_18 [8];
  basic_db_leaf_unique_ptr<key_type,_value_type,_header_type,_unodb::db>_conflict r;
  
  uVar1 = (this->node_ptr).tagged_ptr;
  switch((uint)uVar1 & 7) {
  case 0:
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(uVar1 & 0xfffffffffffffff8);
    local_18 = (undefined1  [8])this->db;
    std::
    unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_18);
    break;
  case 1:
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(uVar1 & 0xfffffffffffffff8);
    local_18 = (undefined1  [8])this->db;
    std::
    unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_18);
    break;
  case 2:
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(uVar1 & 0xfffffffffffffff8);
    local_18 = (undefined1  [8])this->db;
    std::
    unique_ptr<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_18);
    break;
  case 3:
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(uVar1 & 0xfffffffffffffff8);
    local_18 = (undefined1  [8])this->db;
    std::
    unique_ptr<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_18);
    break;
  case 4:
    r._M_t.
    super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    .
    super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
    ._M_head_impl.db =
         (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )(uVar1 & 0xfffffffffffffff8);
    local_18 = (undefined1  [8])this->db;
    std::
    unique_ptr<unodb::detail::inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_256<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_18);
    break;
  default:
    cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x1c8,"~delete_db_node_ptr_at_scope_exit");
  }
  return;
}

Assistant:

~delete_db_node_ptr_at_scope_exit() noexcept {
      switch (node_ptr.type()) {
        case node_type::LEAF: {
          const auto r{
              make_db_leaf_ptr(node_ptr.template ptr<leaf_type *>(), db)};
          return;
        }
        case node_type::I4: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode4_type *>(), db)};
          return;
        }
        case node_type::I16: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode16_type *>(), db)};
          return;
        }
        case node_type::I48: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode48_type *>(), db)};
          return;
        }
        case node_type::I256: {
          const auto r{make_db_inode_unique_ptr(
              node_ptr.template ptr<inode256_type *>(), db)};
          return;
        }
      }
      UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
    }